

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

void __thiscall LayoutFile::processWidget(LayoutFile *this,uint8_t *buf,Widget *widget)

{
  pointer *pppWVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  Button *pBVar5;
  pointer __nbytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  size_t __nbytes_00;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  int __fd;
  iterator iVar6;
  int iVar7;
  int index;
  string name;
  Button *local_70;
  Widget *local_68;
  vector<Widget*,std::allocator<Widget*>> *local_60;
  int local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (0 < widget->numChildren) {
    local_60 = (vector<Widget*,std::allocator<Widget*>> *)&this->widgets;
    iVar7 = 0;
    local_68 = widget;
    do {
      local_54 = 0;
      iVar3 = Util::readInt32(buf,&local_54);
      __nbytes = (this->types).super__Vector_base<LayoutType,_std::allocator<LayoutType>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_50[0] = local_40;
      lVar2 = *(long *)&__nbytes[local_54].name._M_dataplus;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,lVar2,__nbytes[local_54].name._M_string_length + lVar2);
      iVar4 = std::__cxx11::string::compare((char *)local_50);
      __fd = (int)(buf + iVar3);
      if (iVar4 == 0) {
        pBVar5 = (Button *)operator_new(0xb0);
        memset(pBVar5,0,0xb0);
        (pBVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pBVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pBVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar5->super_Widget).name._M_dataplus._M_p = (pointer)&(pBVar5->super_Widget).name.field_2
        ;
        (pBVar5->super_Widget).name._M_string_length = 0;
        (pBVar5->super_Widget).name.field_2._M_local_buf[0] = '\0';
        (pBVar5->super_Widget).stylefile._M_dataplus._M_p =
             (pointer)&(pBVar5->super_Widget).stylefile.field_2;
        (pBVar5->super_Widget).stylefile._M_string_length = 0;
        (pBVar5->super_Widget).stylefile.field_2._M_local_buf[0] = '\0';
        (pBVar5->super_Widget)._vptr_Widget = (_func_int **)&PTR_writeXml_abi_cxx11__00116b20;
        *(undefined1 *)&pBVar5->textTrimming = BarNormal;
        iVar3 = Util::readBool(buf + iVar3,(bool *)&pBVar5->textTrimming);
        buf = (uint8_t *)Widget::read((Widget *)pBVar5,__fd + iVar3,__buf_00,(size_t)__nbytes);
        if (0 < (pBVar5->super_Widget).numChildren) {
          processWidget(this,buf,(Widget *)pBVar5);
        }
        iVar6._M_current =
             (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_70 = pBVar5;
          std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                    ((vector<Widget*,std::allocator<Widget*>> *)&local_68->children,iVar6,
                     (Widget **)&local_70);
        }
        else {
          *iVar6._M_current = (Widget *)pBVar5;
          pppWVar1 = &(local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppWVar1 = *pppWVar1 + 1;
        }
        iVar6._M_current =
             (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_70 = pBVar5;
        if (iVar6._M_current !=
            (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0010e6f1;
        std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                  (local_60,iVar6,(Widget **)&local_70);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_50);
        if (iVar3 == 0) {
          pBVar5 = (Button *)operator_new(0x1c8);
          memset(pBVar5,0,0x1c8);
          (pBVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pBVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pBVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pBVar5->super_Widget).name._M_dataplus._M_p =
               (pointer)&(pBVar5->super_Widget).name.field_2;
          (pBVar5->super_Widget).name._M_string_length = 0;
          (pBVar5->super_Widget).name.field_2._M_local_buf[0] = '\0';
          (pBVar5->super_Widget).stylefile._M_dataplus._M_p =
               (pointer)&(pBVar5->super_Widget).stylefile.field_2;
          (pBVar5->super_Widget).stylefile._M_string_length = 0;
          (pBVar5->super_Widget).stylefile.field_2._M_local_buf[0] = '\0';
          (pBVar5->super_Widget)._vptr_Widget = (_func_int **)&PTR_writeXml_abi_cxx11__00116b90;
          (pBVar5->text)._M_dataplus._M_p = (pointer)&(pBVar5->text).field_2;
          (pBVar5->text)._M_string_length = 0;
          (pBVar5->text).field_2._M_local_buf[0] = '\0';
          (pBVar5->backgroundNormalImage)._M_dataplus._M_p =
               (pointer)&(pBVar5->backgroundNormalImage).field_2;
          (pBVar5->backgroundNormalImage)._M_string_length = 0;
          (pBVar5->backgroundNormalImage).field_2._M_local_buf[0] = '\0';
          (pBVar5->backgroundPressedImage)._M_dataplus._M_p =
               (pointer)&(pBVar5->backgroundPressedImage).field_2;
          (pBVar5->backgroundPressedImage)._M_string_length = 0;
          (pBVar5->backgroundPressedImage).field_2._M_local_buf[0] = '\0';
          (pBVar5->backgroundDisabledImage)._M_dataplus._M_p =
               (pointer)&(pBVar5->backgroundDisabledImage).field_2;
          (pBVar5->backgroundDisabledImage)._M_string_length = 0;
          (pBVar5->backgroundDisabledImage).field_2._M_local_buf[0] = '\0';
          (pBVar5->iconImage)._M_dataplus._M_p = (pointer)&(pBVar5->iconImage).field_2;
          (pBVar5->iconImage)._M_string_length = 0;
          (pBVar5->iconImage).field_2._M_local_buf[0] = '\0';
          (pBVar5->textFont).fontFamily._M_dataplus._M_p =
               (pointer)&(pBVar5->textFont).fontFamily.field_2;
          (pBVar5->textFont).fontFamily._M_string_length = 0;
          (pBVar5->textFont).fontFamily.field_2._M_local_buf[0] = '\0';
          buf = (uint8_t *)Button::read(pBVar5,__fd,__buf_01,(size_t)__nbytes);
          if (0 < (pBVar5->super_Widget).numChildren) {
            processWidget(this,buf,(Widget *)pBVar5);
          }
          iVar6._M_current =
               (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_70 = pBVar5;
            std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                      ((vector<Widget*,std::allocator<Widget*>> *)&local_68->children,iVar6,
                       (Widget **)&local_70);
          }
          else {
            *iVar6._M_current = (Widget *)pBVar5;
            pppWVar1 = &(local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppWVar1 = *pppWVar1 + 1;
          }
          iVar6._M_current =
               (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_70 = pBVar5;
          if (iVar6._M_current !=
              (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_0010e6f1;
          std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                    (local_60,iVar6,(Widget **)&local_70);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_50);
          if (iVar3 == 0) {
            pBVar5 = (Button *)operator_new(0xb8);
            memset(pBVar5,0,0xb8);
            (pBVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pBVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pBVar5->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pBVar5->super_Widget).name._M_dataplus._M_p =
                 (pointer)&(pBVar5->super_Widget).name.field_2;
            (pBVar5->super_Widget).name._M_string_length = 0;
            (pBVar5->super_Widget).name.field_2._M_local_buf[0] = '\0';
            (pBVar5->super_Widget).stylefile._M_dataplus._M_p =
                 (pointer)&(pBVar5->super_Widget).stylefile.field_2;
            (pBVar5->super_Widget).stylefile._M_string_length = 0;
            (pBVar5->super_Widget).stylefile.field_2._M_local_buf[0] = '\0';
            (pBVar5->super_Widget)._vptr_Widget = (_func_int **)&PTR_writeXml_abi_cxx11__00116ca8;
            Color::read(__fd,&pBVar5->textTrimming,__nbytes_00);
            buf = (uint8_t *)Widget::read((Widget *)pBVar5,__fd + 0x10,__buf_02,(size_t)__nbytes);
            if (0 < (pBVar5->super_Widget).numChildren) {
              processWidget(this,buf,(Widget *)pBVar5);
            }
            iVar6._M_current =
                 (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              local_70 = pBVar5;
              std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                        ((vector<Widget*,std::allocator<Widget*>> *)&local_68->children,iVar6,
                         (Widget **)&local_70);
            }
            else {
              *iVar6._M_current = (Widget *)pBVar5;
              pppWVar1 = &(local_68->children).
                          super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppWVar1 = *pppWVar1 + 1;
            }
            iVar6._M_current =
                 (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_70 = pBVar5;
            if (iVar6._M_current !=
                (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_0010e6f1;
            std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                      (local_60,iVar6,(Widget **)&local_70);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)local_50);
            if (iVar3 == 0) {
              pBVar5 = (Button *)operator_new(0x138);
              memset(pBVar5,0,0x138);
              (pBVar5->super_Widget).children.
              super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (pBVar5->super_Widget).children.
              super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (pBVar5->super_Widget).children.
              super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (pBVar5->super_Widget).name._M_dataplus._M_p =
                   (pointer)&(pBVar5->super_Widget).name.field_2;
              (pBVar5->super_Widget).name._M_string_length = 0;
              (pBVar5->super_Widget).name.field_2._M_local_buf[0] = '\0';
              (pBVar5->super_Widget).stylefile._M_dataplus._M_p =
                   (pointer)&(pBVar5->super_Widget).stylefile.field_2;
              (pBVar5->super_Widget).stylefile._M_string_length = 0;
              (pBVar5->super_Widget).stylefile.field_2._M_local_buf[0] = '\0';
              (pBVar5->super_Widget)._vptr_Widget = (_func_int **)&PTR_writeXml_abi_cxx11__00116d18;
              (pBVar5->text)._M_dataplus._M_p = (pointer)&(pBVar5->text).field_2;
              (pBVar5->text)._M_string_length = 0;
              (pBVar5->text).field_2._M_local_buf[0] = '\0';
              (pBVar5->backgroundPressedImage)._M_dataplus._M_p =
                   (pointer)&(pBVar5->backgroundPressedImage).field_2;
              (pBVar5->backgroundPressedImage)._M_string_length = 0;
              (pBVar5->backgroundPressedImage).field_2._M_local_buf[0] = '\0';
              buf = (uint8_t *)Label::read((Label *)pBVar5,__fd,__buf_03,(size_t)__nbytes);
              if (0 < (pBVar5->super_Widget).numChildren) {
                processWidget(this,buf,(Widget *)pBVar5);
              }
              iVar6._M_current =
                   (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_70 = pBVar5;
                std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                          ((vector<Widget*,std::allocator<Widget*>> *)&local_68->children,iVar6,
                           (Widget **)&local_70);
              }
              else {
                *iVar6._M_current = (Widget *)pBVar5;
                pppWVar1 = &(local_68->children).
                            super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                *pppWVar1 = *pppWVar1 + 1;
              }
              iVar6._M_current =
                   (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_70 = pBVar5;
              if (iVar6._M_current !=
                  (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_0010e6f1;
              std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                        (local_60,iVar6,(Widget **)&local_70);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)local_50);
              if (iVar3 == 0) {
                pBVar5 = (Button *)operator_new(0xe0);
                memset(pBVar5,0,0xe0);
                (pBVar5->super_Widget).children.
                super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (pBVar5->super_Widget).children.
                super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                (pBVar5->super_Widget).children.
                super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (pBVar5->super_Widget).name._M_dataplus._M_p =
                     (pointer)&(pBVar5->super_Widget).name.field_2;
                (pBVar5->super_Widget).name._M_string_length = 0;
                (pBVar5->super_Widget).name.field_2._M_local_buf[0] = '\0';
                (pBVar5->super_Widget).stylefile._M_dataplus._M_p =
                     (pointer)&(pBVar5->super_Widget).stylefile.field_2;
                (pBVar5->super_Widget).stylefile._M_string_length = 0;
                (pBVar5->super_Widget).stylefile.field_2._M_local_buf[0] = '\0';
                (pBVar5->super_Widget)._vptr_Widget =
                     (_func_int **)&PTR_writeXml_abi_cxx11__00116d88;
                *(size_type **)&pBVar5->textTrimming = &(pBVar5->text)._M_string_length;
                (pBVar5->text)._M_dataplus._M_p = (pointer)0x0;
                *(undefined1 *)&(pBVar5->text)._M_string_length = 0;
                buf = (uint8_t *)ImageBox::read((ImageBox *)pBVar5,__fd,__buf_04,(size_t)__nbytes);
                if (0 < (pBVar5->super_Widget).numChildren) {
                  processWidget(this,buf,(Widget *)pBVar5);
                }
                iVar6._M_current =
                     (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                local_70 = pBVar5;
                if (iVar6._M_current ==
                    (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                            ((vector<Widget*,std::allocator<Widget*>> *)&local_68->children,iVar6,
                             (Widget **)&local_70);
                }
                else {
                  *iVar6._M_current = (Widget *)pBVar5;
                  pppWVar1 = &(local_68->children).
                              super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppWVar1 = *pppWVar1 + 1;
                }
                iVar6._M_current =
                     (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar6._M_current ==
                    (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*const&>
                            (local_60,iVar6,&local_68);
                }
                else {
                  *iVar6._M_current = local_68;
LAB_0010e6f4:
                  pppWVar1 = &(this->widgets).
                              super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppWVar1 = *pppWVar1 + 1;
                }
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)local_50);
                if (iVar3 == 0) {
                  pBVar5 = (Button *)operator_new(0xd8);
                  memset(pBVar5,0,0xd8);
                  (pBVar5->super_Widget).children.
                  super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  (pBVar5->super_Widget).children.
                  super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  (pBVar5->super_Widget).children.
                  super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  (pBVar5->super_Widget).name._M_dataplus._M_p =
                       (pointer)&(pBVar5->super_Widget).name.field_2;
                  (pBVar5->super_Widget).name._M_string_length = 0;
                  (pBVar5->super_Widget).name.field_2._M_local_buf[0] = '\0';
                  (pBVar5->super_Widget).stylefile._M_dataplus._M_p =
                       (pointer)&(pBVar5->super_Widget).stylefile.field_2;
                  (pBVar5->super_Widget).stylefile._M_string_length = 0;
                  (pBVar5->super_Widget).stylefile.field_2._M_local_buf[0] = '\0';
                  (pBVar5->super_Widget)._vptr_Widget =
                       (_func_int **)&PTR_writeXml_abi_cxx11__00116bc8;
                  (pBVar5->text)._M_dataplus._M_p = (pointer)&(pBVar5->text).field_2;
                  (pBVar5->text)._M_string_length = 0;
                  (pBVar5->text).field_2._M_local_buf[0] = '\0';
                  buf = (uint8_t *)
                        GridListPanel::read((GridListPanel *)pBVar5,__fd,__buf_05,(size_t)__nbytes);
                  if (0 < (pBVar5->super_Widget).numChildren) {
                    processWidget(this,buf,(Widget *)pBVar5);
                  }
                  iVar6._M_current =
                       (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar6._M_current ==
                      (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    local_70 = pBVar5;
                    std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                              ((vector<Widget*,std::allocator<Widget*>> *)&local_68->children,iVar6,
                               (Widget **)&local_70);
                  }
                  else {
                    *iVar6._M_current = (Widget *)pBVar5;
                    pppWVar1 = &(local_68->children).
                                super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                                super__Vector_impl_data._M_finish;
                    *pppWVar1 = *pppWVar1 + 1;
                  }
                  iVar6._M_current =
                       (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  local_70 = pBVar5;
                  if (iVar6._M_current !=
                      (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0010e6f1;
                  std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                            (local_60,iVar6,(Widget **)&local_70);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)local_50);
                  if (iVar3 == 0) {
                    pBVar5 = (Button *)operator_new(0xe8);
                    memset(pBVar5,0,0xe8);
                    (pBVar5->super_Widget).children.
                    super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    (pBVar5->super_Widget).children.
                    super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    (pBVar5->super_Widget).children.
                    super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    (pBVar5->super_Widget).name._M_dataplus._M_p =
                         (pointer)&(pBVar5->super_Widget).name.field_2;
                    (pBVar5->super_Widget).name._M_string_length = 0;
                    (pBVar5->super_Widget).name.field_2._M_local_buf[0] = '\0';
                    (pBVar5->super_Widget).stylefile._M_dataplus._M_p =
                         (pointer)&(pBVar5->super_Widget).stylefile.field_2;
                    (pBVar5->super_Widget).stylefile._M_string_length = 0;
                    (pBVar5->super_Widget).stylefile.field_2._M_local_buf[0] = '\0';
                    (pBVar5->super_Widget)._vptr_Widget =
                         (_func_int **)&PTR_writeXml_abi_cxx11__00116c00;
                    (pBVar5->text).field_2._M_allocated_capacity =
                         (size_type)&pBVar5->backgroundNormalImage;
                    *(undefined8 *)((long)&(pBVar5->text).field_2 + 8) = 0;
                    *(undefined1 *)&(pBVar5->backgroundNormalImage)._M_dataplus._M_p = 0;
                    buf = (uint8_t *)
                          ScrollPanel::read((ScrollPanel *)pBVar5,__fd,__buf_06,(size_t)__nbytes);
                    if (0 < (pBVar5->super_Widget).numChildren) {
                      processWidget(this,buf,(Widget *)pBVar5);
                    }
                    iVar6._M_current =
                         (local_68->children).
                         super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar6._M_current ==
                        (local_68->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      local_70 = pBVar5;
                      std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                                ((vector<Widget*,std::allocator<Widget*>> *)&local_68->children,
                                 iVar6,(Widget **)&local_70);
                    }
                    else {
                      *iVar6._M_current = (Widget *)pBVar5;
                      pppWVar1 = &(local_68->children).
                                  super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish;
                      *pppWVar1 = *pppWVar1 + 1;
                    }
                    iVar6._M_current =
                         (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    local_70 = pBVar5;
                    if (iVar6._M_current !=
                        (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0010e6f1;
                    std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                              (local_60,iVar6,(Widget **)&local_70);
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)local_50);
                    if (iVar3 == 0) {
                      pBVar5 = (Button *)operator_new(0xd8);
                      memset(pBVar5,0,0xd8);
                      (pBVar5->super_Widget).children.
                      super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      (pBVar5->super_Widget).children.
                      super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      (pBVar5->super_Widget).children.
                      super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      (pBVar5->super_Widget).name._M_dataplus._M_p =
                           (pointer)&(pBVar5->super_Widget).name.field_2;
                      (pBVar5->super_Widget).name._M_string_length = 0;
                      (pBVar5->super_Widget).name.field_2._M_local_buf[0] = '\0';
                      (pBVar5->super_Widget).stylefile._M_dataplus._M_p =
                           (pointer)&(pBVar5->super_Widget).stylefile.field_2;
                      (pBVar5->super_Widget).stylefile._M_string_length = 0;
                      (pBVar5->super_Widget).stylefile.field_2._M_local_buf[0] = '\0';
                      (pBVar5->super_Widget)._vptr_Widget =
                           (_func_int **)&PTR_writeXml_abi_cxx11__00116c70;
                      (pBVar5->text)._M_dataplus._M_p = (pointer)&(pBVar5->text).field_2;
                      (pBVar5->text)._M_string_length = 0;
                      (pBVar5->text).field_2._M_local_buf[0] = '\0';
                      buf = (uint8_t *)
                            ListPanel::read((ListPanel *)pBVar5,__fd,__buf_07,(size_t)__nbytes);
                      if (0 < (pBVar5->super_Widget).numChildren) {
                        processWidget(this,buf,(Widget *)pBVar5);
                      }
                      iVar6._M_current =
                           (local_68->children).
                           super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar6._M_current ==
                          (local_68->children).
                          super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        local_70 = pBVar5;
                        std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                                  ((vector<Widget*,std::allocator<Widget*>> *)&local_68->children,
                                   iVar6,(Widget **)&local_70);
                      }
                      else {
                        *iVar6._M_current = (Widget *)pBVar5;
                        pppWVar1 = &(local_68->children).
                                    super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish;
                        *pppWVar1 = *pppWVar1 + 1;
                      }
                      iVar6._M_current =
                           (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                      local_70 = pBVar5;
                      if (iVar6._M_current !=
                          (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0010e6f1;
                      std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                                (local_60,iVar6,(Widget **)&local_70);
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)local_50);
                      if (iVar3 == 0) {
                        pBVar5 = (Button *)operator_new(0x1a8);
                        memset(pBVar5,0,0x1a8);
                        (pBVar5->super_Widget).children.
                        super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)0x0;
                        (pBVar5->super_Widget).children.
                        super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                        super__Vector_impl_data._M_finish = (pointer)0x0;
                        (pBVar5->super_Widget).children.
                        super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        (pBVar5->super_Widget).name._M_dataplus._M_p =
                             (pointer)&(pBVar5->super_Widget).name.field_2;
                        (pBVar5->super_Widget).name._M_string_length = 0;
                        (pBVar5->super_Widget).name.field_2._M_local_buf[0] = '\0';
                        (pBVar5->super_Widget).stylefile._M_dataplus._M_p =
                             (pointer)&(pBVar5->super_Widget).stylefile.field_2;
                        (pBVar5->super_Widget).stylefile._M_string_length = 0;
                        (pBVar5->super_Widget).stylefile.field_2._M_local_buf[0] = '\0';
                        (pBVar5->super_Widget)._vptr_Widget =
                             (_func_int **)&PTR_writeXml_abi_cxx11__00116d50;
                        (pBVar5->text)._M_string_length =
                             (size_type)((long)&(pBVar5->text).field_2 + 8);
                        (pBVar5->text).field_2._M_allocated_capacity = 0;
                        (pBVar5->text).field_2._M_local_buf[8] = '\0';
                        (pBVar5->backgroundNormalImage)._M_string_length =
                             (size_type)((long)&(pBVar5->backgroundNormalImage).field_2 + 8);
                        (pBVar5->backgroundNormalImage).field_2._M_allocated_capacity = 0;
                        (pBVar5->backgroundNormalImage).field_2._M_local_buf[8] = '\0';
                        (pBVar5->backgroundPressedImage)._M_string_length =
                             (size_type)((long)&(pBVar5->backgroundPressedImage).field_2 + 8);
                        (pBVar5->backgroundPressedImage).field_2._M_allocated_capacity = 0;
                        (pBVar5->backgroundPressedImage).field_2._M_local_buf[8] = '\0';
                        *(float **)((long)&(pBVar5->iconImage).field_2 + 8) = &(pBVar5->textColor).b
                        ;
                        (pBVar5->textColor).r = 0.0;
                        (pBVar5->textColor).g = 0.0;
                        *(undefined1 *)&(pBVar5->textColor).b = 0;
                        (pBVar5->textFont).fontFamily._M_string_length =
                             (size_type)((long)&(pBVar5->textFont).fontFamily.field_2 + 8);
                        (pBVar5->textFont).fontFamily.field_2._M_allocated_capacity = 0;
                        (pBVar5->textFont).fontFamily.field_2._M_local_buf[8] = '\0';
                        buf = (uint8_t *)
                              TextField::read((TextField *)pBVar5,__fd,__buf_08,(size_t)__nbytes);
                        if (0 < (pBVar5->super_Widget).numChildren) {
                          processWidget(this,buf,(Widget *)pBVar5);
                        }
                        iVar6._M_current =
                             (local_68->children).
                             super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                        if (iVar6._M_current ==
                            (local_68->children).
                            super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          local_70 = pBVar5;
                          std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                                    ((vector<Widget*,std::allocator<Widget*>> *)&local_68->children,
                                     iVar6,(Widget **)&local_70);
                        }
                        else {
                          *iVar6._M_current = (Widget *)pBVar5;
                          pppWVar1 = &(local_68->children).
                                      super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish;
                          *pppWVar1 = *pppWVar1 + 1;
                        }
                        iVar6._M_current =
                             (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        local_70 = pBVar5;
                        if (iVar6._M_current !=
                            (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0010e6f1;
                        std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                                  (local_60,iVar6,(Widget **)&local_70);
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)local_50);
                        if (iVar3 != 0) {
                          printf("UNSUPPORTED TYPE! [%s]\n",local_50[0]);
                          exit(1);
                        }
                        pBVar5 = (Button *)operator_new(0xb0);
                        memset(pBVar5,0,0xb0);
                        (pBVar5->super_Widget).children.
                        super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)0x0;
                        (pBVar5->super_Widget).children.
                        super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                        super__Vector_impl_data._M_finish = (pointer)0x0;
                        (pBVar5->super_Widget).children.
                        super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        (pBVar5->super_Widget).name._M_dataplus._M_p =
                             (pointer)&(pBVar5->super_Widget).name.field_2;
                        (pBVar5->super_Widget).name._M_string_length = 0;
                        (pBVar5->super_Widget).name.field_2._M_local_buf[0] = '\0';
                        (pBVar5->super_Widget).stylefile._M_dataplus._M_p =
                             (pointer)&(pBVar5->super_Widget).stylefile.field_2;
                        (pBVar5->super_Widget).stylefile._M_string_length = 0;
                        (pBVar5->super_Widget).stylefile.field_2._M_local_buf[0] = '\0';
                        (pBVar5->super_Widget)._vptr_Widget =
                             (_func_int **)&PTR_writeXml_abi_cxx11__00116b58;
                        buf = (uint8_t *)
                              ProgressBar::read((ProgressBar *)pBVar5,__fd,__buf,(size_t)__nbytes);
                        iVar6._M_current =
                             (local_68->children).
                             super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                        if (iVar6._M_current ==
                            (local_68->children).
                            super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          local_70 = pBVar5;
                          std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                                    ((vector<Widget*,std::allocator<Widget*>> *)&local_68->children,
                                     iVar6,(Widget **)&local_70);
                        }
                        else {
                          *iVar6._M_current = (Widget *)pBVar5;
                          pppWVar1 = &(local_68->children).
                                      super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish;
                          *pppWVar1 = *pppWVar1 + 1;
                        }
                        iVar6._M_current =
                             (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        local_70 = pBVar5;
                        if (iVar6._M_current !=
                            (this->widgets).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0010e6f1:
                          *iVar6._M_current = &local_70->super_Widget;
                          goto LAB_0010e6f4;
                        }
                        std::vector<Widget*,std::allocator<Widget*>>::_M_realloc_insert<Widget*>
                                  (local_60,iVar6,(Widget **)&local_70);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_68->numChildren);
  }
  return;
}

Assistant:

void LayoutFile::processWidget(uint8_t* buf, Widget *widget)
{
	for (int i = 0; i < widget->numChildren; i++)
	{
		int index = 0;
		buf += Util::readInt32(buf, index);

		std::string name = types[index].name;

		if (name == "BusyIndicator")
		{
			BusyIndicator *bi = new BusyIndicator();
			buf = bi->read(buf);
			
			if (bi->numChildren > 0)
				processWidget(buf, bi);

			widget->children.push_back(bi);
			widgets.push_back(bi);
		}
		else if (name == "Button")
		{
			Button *button = new Button();
			buf = button->read(buf);

			if (button->numChildren > 0)
				processWidget(buf, button);

			widget->children.push_back(button);
			widgets.push_back(button);
		}
		else if (name == "Panel")
		{
			Panel *panel = new Panel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "Label")
		{
			Label *label = new Label();
			buf = label->read(buf);

			if (label->numChildren > 0)
				processWidget(buf, label);

			widget->children.push_back(label);
			widgets.push_back(label);
		}
		else if (name == "ImageBox")
		{
			ImageBox *imageBox = new ImageBox();
			buf = imageBox->read(buf);

			if (imageBox->numChildren > 0)
			{
				processWidget(buf, imageBox);
			}

			widget->children.push_back(imageBox);
			widgets.push_back(widget);
		}
		else if (name == "GridListPanel")
		{
			GridListPanel *panel = new GridListPanel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "ScrollPanel")
		{
			ScrollPanel *panel = new ScrollPanel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "ListPanel")
		{
			ListPanel *panel = new ListPanel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "TextField")
		{
			TextField *textField = new TextField();
			buf = textField->read(buf);

			if (textField->numChildren > 0)
				processWidget(buf, textField);

			widget->children.push_back(textField);
			widgets.push_back(textField);
		}
		else if (name == "ProgressBar")
		{
			ProgressBar *progressBar = new ProgressBar();
			buf = progressBar->read(buf);

			widget->children.push_back(progressBar);
			widgets.push_back(progressBar);
		}
		else
		{
			printf("UNSUPPORTED TYPE! [%s]\n", name.c_str());
			exit(1);
		}
	}
}